

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_false>::insert_tail_(DaTrie<true,_true,_false> *this,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference pvVar4;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  size_t i;
  uint32_t value;
  uint32_t tail_pos;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_stack_ffffffffffffffb8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  ulong local_28;
  
  bVar1 = Query::is_finished(in_RSI);
  if (bVar1) {
    uVar2 = Query::node_pos(in_RSI);
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
    uVar2 = Query::value(in_RSI);
    Bc::set_value(pvVar4,uVar2);
  }
  else {
    uVar2 = tail_size((DaTrie<true,_true,_false> *)0x16634a);
    uVar3 = Query::node_pos(in_RSI);
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    Bc::set_value(pvVar4,uVar2);
    while( true ) {
      bVar1 = Query::is_finished(in_RSI);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffffb8 = in_RDI + 1;
      Query::label(in_RSI);
      std::vector<char,_std::allocator<char>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type_conflict *)in_stack_ffffffffffffffb8);
      Query::next(in_RSI);
    }
    Query::value(in_RSI);
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      std::vector<char,_std::allocator<char>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type_conflict *)in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void insert_tail_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    if (query.is_finished()) {
      bc_[query.node_pos()].set_value(query.value());
      return;
    }

    auto tail_pos = tail_size();
    bc_[query.node_pos()].set_value(tail_pos);

    while (!query.is_finished()) {
      tail_.push_back(query.label());
      query.next();
    }

    auto value = query.value();
    for (size_t i = 0; i < sizeof(uint32_t); ++i) {
      tail_.push_back(static_cast<uint8_t>(value & 0xFF));
      value >>= 8;
    }
  }